

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<JsUtil::Pair<unsigned_int,int,DefaultComparer>>
          (BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,Pair<unsigned_int,_int,_DefaultComparer> *key,PropertySym **value)

{
  int iVar1;
  PropertySym **ppPVar2;
  int i;
  PropertySym **value_local;
  Pair<unsigned_int,_int,_DefaultComparer> *key_local;
  BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<JsUtil::Pair<unsigned_int,int,DefaultComparer>>(this,key);
  if (-1 < iVar1) {
    ppPVar2 = anon_unknown_5::
              ValueEntry<PropertySym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*>_>
              ::Value((ValueEntry<PropertySym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*>_>
                       *)(*(long *)(this + 8) + (long)iVar1 * 0x18));
    *value = *ppPVar2;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }